

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BaseFab.H
# Opt level: O1

pair<double,_double> __thiscall
amrex::BaseFab<double>::minmax<(amrex::RunOn)1>(BaseFab<double> *this,Box *subbox,int comp)

{
  Box *pBVar1;
  int iVar2;
  pair<double,_double> pVar3;
  long lVar4;
  long lVar5;
  double rmin;
  double rmax;
  double local_90;
  double local_88;
  anon_class_80_3_0e4789f6 local_80;
  
  pBVar1 = &this->domain;
  local_80.a.begin.z = (this->domain).smallend.vect[2];
  local_80.a.begin.x = (pBVar1->smallend).vect[0];
  local_80.a.begin.y = (pBVar1->smallend).vect[1];
  lVar4 = (long)(this->domain).bigend.vect[1] + 1;
  iVar2 = (this->domain).bigend.vect[0];
  lVar5 = (long)(this->domain).bigend.vect[2] + 1;
  local_80.a.jstride = ((long)iVar2 - (long)(pBVar1->smallend).vect[0]) + 1;
  local_80.a.kstride = (lVar4 - (this->domain).smallend.vect[1]) * local_80.a.jstride;
  local_80.a.nstride = (lVar5 - local_80.a.begin.z) * local_80.a.kstride;
  local_80.a.p = this->dptr + local_80.a.nstride * comp;
  local_80.a.end._0_8_ = (ulong)(iVar2 + 1) | lVar4 << 0x20;
  local_80.a.ncomp = this->nvar - comp;
  local_80.rmax = &local_88;
  local_88 = -1.79769313486232e+308;
  local_80.rmin = &local_90;
  local_90 = 1.79769313486232e+308;
  local_80.a.end.z = (int)lVar5;
  LoopOnCpu<amrex::BaseFab<double>::minmax<(amrex::RunOn)1>(amrex::Box_const&,int)const::_lambda(int,int,int)_1_>
            (subbox,&local_80);
  pVar3.second = local_88;
  pVar3.first = local_90;
  return pVar3;
}

Assistant:

std::pair<T,T>
BaseFab<T>::minmax (const Box& subbox, int comp) const noexcept
{
    Array4<T const> const& a = this->const_array(comp);
#ifdef AMREX_USE_GPU
    if (run_on == RunOn::Device && Gpu::inLaunchRegion()) {
        ReduceOps<ReduceOpMin,ReduceOpMax> reduce_op;
        ReduceData<T,T> reduce_data(reduce_op);
        using ReduceTuple = typename decltype(reduce_data)::Type;
        reduce_op.eval(subbox, reduce_data,
        [=] AMREX_GPU_DEVICE (int i, int j, int k) -> ReduceTuple
        {
            auto const x = a(i,j,k);
            return { x, x };
        });
        ReduceTuple hv = reduce_data.value(reduce_op);
        return std::make_pair(amrex::get<0>(hv), amrex::get<1>(hv));
    } else
#endif
    {
        T rmax = std::numeric_limits<T>::lowest();
        T rmin = std::numeric_limits<T>::max();
        amrex::LoopOnCpu(subbox, [=,&rmin,&rmax] (int i, int j, int k) noexcept
        {
            auto const x = a(i,j,k);
            rmin = amrex::min(rmin, x);
            rmax = amrex::max(rmax, x);
        });
        return std::make_pair(rmin,rmax);
    }
}